

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O2

void match_and_run(Am_Object *cmd_or_inter,Am_Object *match_command)

{
  bool bVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  Am_Wrapper *in_value;
  Am_Am_Slot_Key slot;
  Am_Object script_execute_command;
  Am_Object start_object;
  Am_Object widget;
  Am_Object orig_command;
  Am_Value current_value;
  Am_Value target_value;
  Am_Value_List slots_to_match;
  Am_Value cmd_value;
  
  pAVar2 = Am_Object::Get(match_command,Am_ORIG_COMMAND,0);
  Am_Object::Am_Object(&orig_command,pAVar2);
  poVar3 = std::operator<<((ostream *)&std::cout,"Match command ");
  poVar3 = operator<<(poVar3,match_command);
  poVar3 = std::operator<<(poVar3," cmd_or_inter ");
  poVar3 = operator<<(poVar3,cmd_or_inter);
  poVar3 = std::operator<<(poVar3," orig_command ");
  poVar3 = operator<<(poVar3,&orig_command);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::ostream::flush();
  pAVar2 = Am_Object::Get(match_command,0xf7,1);
  bVar1 = Am_Value::Valid(pAVar2);
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"Exiting because recursive\n");
    std::ostream::flush();
  }
  else {
    pAVar2 = Am_Object::Get(match_command,0xb8,0);
    Am_Value_List::Am_Value_List(&slots_to_match,pAVar2);
    pAVar2 = Am_Object::Get(cmd_or_inter,0x11a,1);
    Am_Object::Am_Object(&start_object,pAVar2);
    slot.value = 0;
    target_value.type = 0;
    target_value.value.wrapper_value = (Am_Wrapper *)0x0;
    current_value.type = 0;
    current_value.value.wrapper_value = (Am_Wrapper *)0x0;
    cmd_value.type = 0;
    cmd_value.value.wrapper_value = (Am_Wrapper *)0x0;
    Am_Value_List::Start(&slots_to_match);
    while( true ) {
      bVar1 = Am_Value_List::Last(&slots_to_match);
      if (bVar1) break;
      pAVar2 = Am_Value_List::Get(&slots_to_match);
      Am_Am_Slot_Key::operator=(&slot,pAVar2);
      pAVar2 = Am_Object::Get(match_command,slot.value,1);
      Am_Value::operator=(&target_value,pAVar2);
      Am_Value::operator=(&current_value,&Am_No_Value);
      bVar1 = Am_Value::Valid(&target_value);
      if (bVar1) {
        bVar1 = Am_Object::Valid(&start_object);
        if (bVar1) {
          if (slot.value == Am_LOCATION_PLACEHOLDER) {
            Am_Inter_Location::Am_Inter_Location
                      ((Am_Inter_Location *)&script_execute_command,&start_object);
            in_value = Am_Inter_Location::operator_cast_to_Am_Wrapper_
                                 ((Am_Inter_Location *)&script_execute_command);
            Am_Value::operator=(&current_value,in_value);
            Am_Inter_Location::~Am_Inter_Location((Am_Inter_Location *)&script_execute_command);
          }
          else {
            pAVar2 = Am_Object::Get(&start_object,slot.value,1);
            Am_Value::operator=(&current_value,pAVar2);
          }
        }
        bVar1 = Am_Value::Valid(&current_value);
        if (!bVar1) {
          pAVar2 = Am_Object::Get(&orig_command,slot.value,1);
          Am_Value::operator=(&current_value,pAVar2);
        }
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"  Matching slot ");
      poVar3 = operator<<(poVar3,&slot);
      poVar3 = std::operator<<(poVar3," target `");
      poVar3 = operator<<(poVar3,&target_value);
      poVar3 = std::operator<<(poVar3,"\' cmd value `");
      poVar3 = operator<<(poVar3,&current_value);
      std::operator<<(poVar3,"\'\n");
      std::ostream::flush();
      bVar1 = Am_Value::Valid(&target_value);
      if (bVar1) {
        bVar1 = Am_Value::Valid(&current_value);
        if (bVar1) {
          bVar1 = match_value_or_list(&target_value,&current_value);
          if (!bVar1) goto LAB_00208c2c;
        }
      }
      Am_Value_List::Next(&slots_to_match);
    }
    Am_Object::Set(match_command,0xf7,true,1);
    pAVar2 = Am_Object::Get(match_command,Am_SCRIPT_EXECUTE_COMMAND,0);
    Am_Object::Am_Object(&script_execute_command,pAVar2);
    pAVar2 = Am_Object::Get(match_command,Am_WIDGET_FOR_COMMAND,0);
    Am_Object::Am_Object(&widget,pAVar2);
    poVar3 = std::operator<<((ostream *)&std::cout,"%% Calling ");
    poVar3 = operator<<(poVar3,&script_execute_command);
    poVar3 = std::operator<<(poVar3," for widget ");
    poVar3 = operator<<(poVar3,&widget);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::ostream::flush();
    Am_Execute_Command(&script_execute_command,&widget);
    Am_Object::Set(match_command,0xf7,false,0);
    Am_Object::~Am_Object(&widget);
    Am_Object::~Am_Object(&script_execute_command);
LAB_00208c2c:
    Am_Value::~Am_Value(&cmd_value);
    Am_Value::~Am_Value(&current_value);
    Am_Value::~Am_Value(&target_value);
    Am_Object::~Am_Object(&start_object);
    Am_Value_List::~Am_Value_List(&slots_to_match);
  }
  Am_Object::~Am_Object(&orig_command);
  return;
}

Assistant:

void
match_and_run(Am_Object &cmd_or_inter, Am_Object &match_command)
{
  Am_Object orig_command = match_command.Get(Am_ORIG_COMMAND);
  std::cout << "Match command " << match_command << " cmd_or_inter "
            << cmd_or_inter << " orig_command " << orig_command << std::endl
            << std::flush;
  //check for recursive call
  if (match_command.Peek(Am_RUNNING).Valid()) {
    std::cout << "Exiting because recursive\n" << std::flush;
    return;
  }
  Am_Value_List slots_to_match = match_command.Get(Am_SLOTS_TO_SAVE);
  Am_Object start_object = cmd_or_inter.Peek(Am_START_OBJECT);
  Am_Am_Slot_Key slot;
  Am_Value target_value, current_value, cmd_value;
  for (slots_to_match.Start(); !slots_to_match.Last(); slots_to_match.Next()) {
    slot = slots_to_match.Get();
    target_value = match_command.Peek(slot);
    current_value = Am_No_Value;
    if (target_value.Valid()) {
      if (start_object.Valid()) {
        if (slot == Am_LOCATION_PLACEHOLDER) {
          Am_Inter_Location loc(start_object);
          current_value = loc;
        } else
          current_value = start_object.Peek(slot);
      }
      if (!current_value.Valid())
        current_value = orig_command.Peek(slot);
    }
    std::cout << "  Matching slot " << slot << " target `" << target_value
              << "' cmd value `" << current_value << "'\n"
              << std::flush;
    if (target_value.Valid() && current_value.Valid()) {
      if (!match_value_or_list(target_value, current_value))
        return; //doesn't match
    }
  }

  // if get here, then matches, so execute the script
  match_command.Set(Am_RUNNING, true, Am_OK_IF_NOT_THERE);
  Am_Object script_execute_command =
      match_command.Get(Am_SCRIPT_EXECUTE_COMMAND);
  Am_Object widget = match_command.Get(Am_WIDGET_FOR_COMMAND);
  std::cout << "%% Calling " << script_execute_command << " for widget "
            << widget << std::endl
            << std::flush;
  Am_Execute_Command(script_execute_command, widget);
  match_command.Set(Am_RUNNING, false);
}